

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O3

RealType __thiscall
OpenMD::RepulsivePower::getSuggestedCutoffRadius
          (RepulsivePower *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  RealType RVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->RPtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[iVar2];
  iVar2 = piVar1[iVar3];
  RVar5 = 0.0;
  if (iVar2 != -1 && lVar4 != -1) {
    RVar5 = *(double *)
             (*(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>
                        ._M_impl.super__Vector_impl_data + (long)iVar2 * 0x20) * 2.5;
  }
  return RVar5;
}

Assistant:

RealType RepulsivePower::getSuggestedCutoffRadius(
      pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1  = atypes.first->getIdent();
    int atid2  = atypes.second->getIdent();
    int rptid1 = RPtids[atid1];
    int rptid2 = RPtids[atid2];

    if (rptid1 == -1 || rptid2 == -1)
      return 0.0;
    else {
      RPInteractionData mixer = MixingMap[rptid1][rptid2];
      return 2.5 * mixer.sigma;
    }
  }